

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O1

int run_test_tty(void)

{
  uint uVar1;
  int iVar2;
  uv_handle_type uVar3;
  int iVar4;
  int extraout_EAX;
  uv_loop_t *loop;
  int *piVar5;
  uv_loop_t *loop_00;
  uv_handle_t *handle;
  int64_t eval_b_5;
  int64_t eval_b_6;
  int height;
  int width;
  uv_tty_t tty_out;
  uv_tty_t tty_in;
  undefined1 auStack_e78 [32];
  uv_tty_t uStack_e58;
  uv_tty_t uStack_d40;
  uv_loop_t uStack_c28;
  uv_loop_t *puStack_900;
  code *pcStack_8f8;
  long lStack_8f0;
  long lStack_8e8;
  undefined1 auStack_8e0 [280];
  undefined1 auStack_7c8 [280];
  undefined1 auStack_6b0 [1088];
  uv_loop_t *puStack_270;
  long local_260;
  long local_258;
  uint local_250;
  uint local_24c;
  uv_tty_t local_248;
  uv_tty_t local_130;
  
  puStack_270 = (uv_loop_t *)0x1d46b0;
  loop = uv_default_loop();
  puStack_270 = (uv_loop_t *)0x1d46c5;
  uVar1 = open64("/dev/tty",0,0);
  if ((int)uVar1 < 0) {
    puStack_270 = (uv_loop_t *)0x1d4af8;
    run_test_tty_cold_24();
    return 7;
  }
  piVar5 = (int *)(ulong)uVar1;
  puStack_270 = (uv_loop_t *)0x1d46e5;
  iVar2 = open64("/dev/tty",1,0);
  if (iVar2 < 0) {
    puStack_270 = (uv_loop_t *)0x1d4b02;
    run_test_tty_cold_23();
    return 7;
  }
  local_248.data = (void *)0x0;
  local_130.data = (void *)0x0;
  puStack_270 = (uv_loop_t *)0x1d4752;
  uVar3 = uv_guess_handle(-1);
  local_248.data = (void *)(ulong)uVar3;
  if (local_130.data == local_248.data) {
    local_130.data = (void *)0xe;
    puStack_270 = (uv_loop_t *)0x1d4780;
    uVar3 = uv_guess_handle(uVar1);
    local_248.data = (void *)(ulong)uVar3;
    if (local_130.data != local_248.data) goto LAB_001d4b3d;
    local_130.data = (void *)0xe;
    puStack_270 = (uv_loop_t *)0x1d47ad;
    uVar3 = uv_guess_handle(iVar2);
    local_248.data = (void *)(ulong)uVar3;
    if (local_130.data != local_248.data) goto LAB_001d4b4f;
    puStack_270 = (uv_loop_t *)0x1d47df;
    iVar4 = uv_tty_init(loop,&local_130,uVar1,1);
    local_248.data = (void *)(long)iVar4;
    local_260 = 0;
    if (local_248.data != (void *)0x0) goto LAB_001d4b61;
    puStack_270 = (uv_loop_t *)0x1d480c;
    iVar4 = uv_is_readable((uv_stream_t *)&local_130);
    if (iVar4 == 0) goto LAB_001d4b70;
    puStack_270 = (uv_loop_t *)0x1d4821;
    iVar4 = uv_is_writable((uv_stream_t *)&local_130);
    if (iVar4 != 0) goto LAB_001d4b75;
    puStack_270 = (uv_loop_t *)0x1d483a;
    iVar2 = uv_tty_init(loop,&local_248,iVar2,0);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4b7a;
    puStack_270 = (uv_loop_t *)0x1d4864;
    iVar2 = uv_is_readable((uv_stream_t *)&local_248);
    if (iVar2 != 0) goto LAB_001d4b89;
    puStack_270 = (uv_loop_t *)0x1d4876;
    iVar2 = uv_is_writable((uv_stream_t *)&local_248);
    if (iVar2 == 0) goto LAB_001d4b8e;
    puStack_270 = (uv_loop_t *)0x1d4892;
    iVar2 = uv_tty_get_winsize(&local_248,(int *)&local_24c,(int *)&local_250);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4b93;
    puStack_270 = (uv_loop_t *)0x1d48c8;
    printf("width=%d height=%d\n",(ulong)local_24c,(ulong)local_250);
    if (local_24c == 0 && local_250 == 0) {
      puStack_270 = (uv_loop_t *)0x1d48e8;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      puStack_270 = (uv_loop_t *)0x1d48f2;
      uv_run(loop,UV_RUN_DEFAULT);
      local_260 = 0;
      puStack_270 = (uv_loop_t *)0x1d4903;
      iVar2 = uv_loop_close(loop);
      local_258 = (long)iVar2;
      if (local_260 == local_258) {
        puStack_270 = (uv_loop_t *)0x1d491f;
        uv_library_shutdown();
        return 7;
      }
      goto LAB_001d4ba2;
    }
    local_258 = 0;
    local_260 = (long)(int)local_24c;
    if ((long)(int)local_24c < 1) goto LAB_001d4bb1;
    local_260 = (long)(int)local_250;
    local_258 = 0;
    if (local_260 < 1) goto LAB_001d4bc0;
    puStack_270 = (uv_loop_t *)0x1d497a;
    iVar2 = uv_tty_set_mode(&local_130,UV_TTY_MODE_RAW);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4bcf;
    puStack_270 = (uv_loop_t *)0x1d49a9;
    iVar2 = uv_tty_set_mode(&local_130,UV_TTY_MODE_NORMAL);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4bde;
    puStack_270 = (uv_loop_t *)0x1d49ce;
    piVar5 = __errno_location();
    *piVar5 = 0;
    puStack_270 = (uv_loop_t *)0x1d49dc;
    iVar2 = uv_tty_reset_mode();
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4bed;
    puStack_270 = (uv_loop_t *)0x1d4a01;
    iVar2 = uv_tty_reset_mode();
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4bfc;
    puStack_270 = (uv_loop_t *)0x1d4a26;
    iVar2 = uv_tty_reset_mode();
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4c0b;
    local_260 = (long)*piVar5;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4c1a;
    piVar5 = (int *)0x0;
    puStack_270 = (uv_loop_t *)0x1d4a79;
    uv_close((uv_handle_t *)&local_130,(uv_close_cb)0x0);
    puStack_270 = (uv_loop_t *)0x1d4a85;
    uv_close((uv_handle_t *)&local_248,(uv_close_cb)0x0);
    puStack_270 = (uv_loop_t *)0x1d4a8f;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_270 = (uv_loop_t *)0x1d4a94;
    loop = uv_default_loop();
    puStack_270 = (uv_loop_t *)0x1d4aa8;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_270 = (uv_loop_t *)0x1d4ab2;
    uv_run(loop,UV_RUN_DEFAULT);
    local_260 = 0;
    puStack_270 = (uv_loop_t *)0x1d4ac0;
    loop_00 = uv_default_loop();
    puStack_270 = (uv_loop_t *)0x1d4ac8;
    iVar2 = uv_loop_close(loop_00);
    local_258 = (long)iVar2;
    if (local_260 == local_258) {
      puStack_270 = (uv_loop_t *)0x1d4ae4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_270 = (uv_loop_t *)0x1d4b3d;
    run_test_tty_cold_1();
LAB_001d4b3d:
    puStack_270 = (uv_loop_t *)0x1d4b4f;
    run_test_tty_cold_2();
LAB_001d4b4f:
    puStack_270 = (uv_loop_t *)0x1d4b61;
    run_test_tty_cold_3();
LAB_001d4b61:
    puStack_270 = (uv_loop_t *)0x1d4b70;
    run_test_tty_cold_4();
LAB_001d4b70:
    puStack_270 = (uv_loop_t *)0x1d4b75;
    run_test_tty_cold_20();
LAB_001d4b75:
    puStack_270 = (uv_loop_t *)0x1d4b7a;
    run_test_tty_cold_5();
LAB_001d4b7a:
    puStack_270 = (uv_loop_t *)0x1d4b89;
    run_test_tty_cold_6();
LAB_001d4b89:
    puStack_270 = (uv_loop_t *)0x1d4b8e;
    run_test_tty_cold_7();
LAB_001d4b8e:
    puStack_270 = (uv_loop_t *)0x1d4b93;
    run_test_tty_cold_19();
LAB_001d4b93:
    puStack_270 = (uv_loop_t *)0x1d4ba2;
    run_test_tty_cold_8();
LAB_001d4ba2:
    puStack_270 = (uv_loop_t *)0x1d4bb1;
    run_test_tty_cold_18();
LAB_001d4bb1:
    puStack_270 = (uv_loop_t *)0x1d4bc0;
    run_test_tty_cold_9();
LAB_001d4bc0:
    puStack_270 = (uv_loop_t *)0x1d4bcf;
    run_test_tty_cold_10();
LAB_001d4bcf:
    puStack_270 = (uv_loop_t *)0x1d4bde;
    run_test_tty_cold_11();
LAB_001d4bde:
    puStack_270 = (uv_loop_t *)0x1d4bed;
    run_test_tty_cold_12();
LAB_001d4bed:
    puStack_270 = (uv_loop_t *)0x1d4bfc;
    run_test_tty_cold_13();
LAB_001d4bfc:
    puStack_270 = (uv_loop_t *)0x1d4c0b;
    run_test_tty_cold_14();
LAB_001d4c0b:
    puStack_270 = (uv_loop_t *)0x1d4c1a;
    run_test_tty_cold_15();
LAB_001d4c1a:
    puStack_270 = (uv_loop_t *)0x1d4c29;
    run_test_tty_cold_16();
  }
  puStack_270 = (uv_loop_t *)run_test_tty_file;
  run_test_tty_cold_17();
  pcStack_8f8 = (code *)0x1d4c4d;
  puStack_270 = loop;
  iVar2 = uv_loop_init((uv_loop_t *)(auStack_6b0 + 0x118));
  auStack_6b0._0_8_ = SEXT48(iVar2);
  auStack_7c8._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_6b0._0_8_ == (uv__queue *)0x0) {
    pcStack_8f8 = (code *)0x1d4c89;
    uVar1 = open64("test/fixtures/empty_file",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d4cbc;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ != auStack_8e0._0_8_) goto LAB_001d5193;
      pcStack_8f8 = (code *)0x1d4cdd;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ != (uv__queue *)0x0) goto LAB_001d51a5;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d4d2b;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ == auStack_8e0._0_8_) goto LAB_001d4d45;
      goto LAB_001d51c9;
    }
LAB_001d4d45:
    pcStack_8f8 = (code *)0x1d4d55;
    uVar1 = open64("/dev/random",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d4d84;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ != auStack_8e0._0_8_) goto LAB_001d51b7;
      pcStack_8f8 = (code *)0x1d4da5;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ == (uv__queue *)0x0) goto LAB_001d4dcb;
      goto LAB_001d51db;
    }
LAB_001d4dcb:
    pcStack_8f8 = (code *)0x1d4ddb;
    uVar1 = open64("/dev/zero",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d4e0a;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ != auStack_8e0._0_8_) goto LAB_001d51ed;
      pcStack_8f8 = (code *)0x1d4e2b;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ == (uv__queue *)0x0) goto LAB_001d4e51;
      goto LAB_001d51ff;
    }
LAB_001d4e51:
    pcStack_8f8 = (code *)0x1d4e64;
    uVar1 = open64("/dev/tty",2);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      pcStack_8f8 = (code *)0x1d4e8b;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ != (uv__queue *)0x0) goto LAB_001d5211;
      pcStack_8f8 = (code *)0x1d4eb8;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ != (uv__queue *)0x0) goto LAB_001d5223;
      pcStack_8f8 = (code *)0x1d4eeb;
      iVar2 = uv_is_readable((uv_stream_t *)auStack_6b0);
      if (iVar2 == 0) goto LAB_001d5235;
      pcStack_8f8 = (code *)0x1d4f00;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_6b0);
      if (iVar2 == 0) goto LAB_001d523a;
      loop = (uv_loop_t *)auStack_6b0;
      pcStack_8f8 = (code *)0x1d4f1a;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_8f8 = (code *)0x1d4f22;
      iVar2 = uv_is_readable((uv_stream_t *)loop);
      if (iVar2 != 0) goto LAB_001d524c;
      pcStack_8f8 = (code *)0x1d4f37;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_6b0);
      if (iVar2 == 0) goto LAB_001d4f3f;
      goto LAB_001d525e;
    }
LAB_001d4f3f:
    pcStack_8f8 = (code *)0x1d4f4f;
    uVar1 = open64("/dev/tty",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      pcStack_8f8 = (code *)0x1d4f76;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_7c8,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      lStack_8f0 = 0;
      if ((uv__queue *)auStack_8e0._0_8_ != (uv__queue *)0x0) goto LAB_001d523f;
      pcStack_8f8 = (code *)0x1d4f9b;
      iVar2 = close(uVar1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      lStack_8f0 = 0;
      if ((uv__queue *)auStack_8e0._0_8_ != (uv__queue *)0x0) goto LAB_001d5251;
      pcStack_8f8 = (code *)0x1d4fc6;
      iVar2 = uv_is_readable((uv_stream_t *)auStack_7c8);
      if (iVar2 == 0) goto LAB_001d5263;
      pcStack_8f8 = (code *)0x1d4fdb;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_7c8);
      if (iVar2 != 0) goto LAB_001d5268;
      loop = (uv_loop_t *)auStack_7c8;
      pcStack_8f8 = (code *)0x1d4ff5;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_8f8 = (code *)0x1d4ffd;
      iVar2 = uv_is_readable((uv_stream_t *)loop);
      if (iVar2 != 0) goto LAB_001d527a;
      pcStack_8f8 = (code *)0x1d5012;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_7c8);
      if (iVar2 == 0) goto LAB_001d501a;
      goto LAB_001d528c;
    }
LAB_001d501a:
    pcStack_8f8 = (code *)0x1d502d;
    uVar1 = open64("/dev/tty",1);
    if (uVar1 == 0xffffffff) {
LAB_001d50e6:
      pcStack_8f8 = (code *)0x1d50f5;
      iVar2 = uv_run((uv_loop_t *)(auStack_6b0 + 0x118),UV_RUN_DEFAULT);
      lStack_8f0 = (long)iVar2;
      lStack_8e8 = 0;
      if (lStack_8f0 != 0) goto LAB_001d5179;
      loop = (uv_loop_t *)(auStack_6b0 + 0x118);
      pcStack_8f8 = (code *)0x1d5128;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_8f8 = (code *)0x1d5132;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_8f0 = 0;
      pcStack_8f8 = (code *)0x1d5142;
      iVar2 = uv_loop_close(loop);
      lStack_8e8 = (long)iVar2;
      if (lStack_8f0 == lStack_8e8) {
        pcStack_8f8 = (code *)0x1d5159;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d5186;
    }
    loop = (uv_loop_t *)(ulong)uVar1;
    pcStack_8f8 = (code *)0x1d504e;
    iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_8e0,uVar1,0);
    lStack_8f0 = (long)iVar2;
    lStack_8e8 = 0;
    if (lStack_8f0 != 0) goto LAB_001d526d;
    pcStack_8f8 = (code *)0x1d5073;
    iVar2 = close(uVar1);
    lStack_8f0 = (long)iVar2;
    lStack_8e8 = 0;
    if (lStack_8f0 != 0) goto LAB_001d527f;
    pcStack_8f8 = (code *)0x1d509b;
    iVar2 = uv_is_readable((uv_stream_t *)auStack_8e0);
    if (iVar2 != 0) goto LAB_001d5291;
    pcStack_8f8 = (code *)0x1d50ad;
    iVar2 = uv_is_writable((uv_stream_t *)auStack_8e0);
    if (iVar2 == 0) goto LAB_001d5296;
    loop = (uv_loop_t *)auStack_8e0;
    pcStack_8f8 = (code *)0x1d50c4;
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    pcStack_8f8 = (code *)0x1d50cc;
    iVar2 = uv_is_readable((uv_stream_t *)loop);
    if (iVar2 != 0) goto LAB_001d529b;
    pcStack_8f8 = (code *)0x1d50de;
    iVar2 = uv_is_writable((uv_stream_t *)auStack_8e0);
    if (iVar2 == 0) goto LAB_001d50e6;
  }
  else {
    pcStack_8f8 = (code *)0x1d5179;
    run_test_tty_file_cold_1();
LAB_001d5179:
    pcStack_8f8 = (code *)0x1d5186;
    run_test_tty_file_cold_27();
LAB_001d5186:
    pcStack_8f8 = (code *)0x1d5193;
    run_test_tty_file_cold_28();
LAB_001d5193:
    pcStack_8f8 = (code *)0x1d51a5;
    run_test_tty_file_cold_2();
LAB_001d51a5:
    pcStack_8f8 = (code *)0x1d51b7;
    run_test_tty_file_cold_3();
LAB_001d51b7:
    pcStack_8f8 = (code *)0x1d51c9;
    run_test_tty_file_cold_5();
LAB_001d51c9:
    pcStack_8f8 = (code *)0x1d51db;
    run_test_tty_file_cold_4();
LAB_001d51db:
    pcStack_8f8 = (code *)0x1d51ed;
    run_test_tty_file_cold_6();
LAB_001d51ed:
    pcStack_8f8 = (code *)0x1d51ff;
    run_test_tty_file_cold_7();
LAB_001d51ff:
    pcStack_8f8 = (code *)0x1d5211;
    run_test_tty_file_cold_8();
LAB_001d5211:
    pcStack_8f8 = (code *)0x1d5223;
    run_test_tty_file_cold_9();
LAB_001d5223:
    pcStack_8f8 = (code *)0x1d5235;
    run_test_tty_file_cold_10();
LAB_001d5235:
    pcStack_8f8 = (code *)0x1d523a;
    run_test_tty_file_cold_14();
LAB_001d523a:
    pcStack_8f8 = (code *)0x1d523f;
    run_test_tty_file_cold_13();
LAB_001d523f:
    pcStack_8f8 = (code *)0x1d524c;
    run_test_tty_file_cold_15();
LAB_001d524c:
    pcStack_8f8 = (code *)0x1d5251;
    run_test_tty_file_cold_11();
LAB_001d5251:
    pcStack_8f8 = (code *)0x1d525e;
    run_test_tty_file_cold_16();
LAB_001d525e:
    pcStack_8f8 = (code *)0x1d5263;
    run_test_tty_file_cold_12();
LAB_001d5263:
    pcStack_8f8 = (code *)0x1d5268;
    run_test_tty_file_cold_20();
LAB_001d5268:
    pcStack_8f8 = (code *)0x1d526d;
    run_test_tty_file_cold_17();
LAB_001d526d:
    pcStack_8f8 = (code *)0x1d527a;
    run_test_tty_file_cold_21();
LAB_001d527a:
    pcStack_8f8 = (code *)0x1d527f;
    run_test_tty_file_cold_18();
LAB_001d527f:
    pcStack_8f8 = (code *)0x1d528c;
    run_test_tty_file_cold_22();
LAB_001d528c:
    pcStack_8f8 = (code *)0x1d5291;
    run_test_tty_file_cold_19();
LAB_001d5291:
    pcStack_8f8 = (code *)0x1d5296;
    run_test_tty_file_cold_23();
LAB_001d5296:
    pcStack_8f8 = (code *)0x1d529b;
    run_test_tty_file_cold_26();
LAB_001d529b:
    pcStack_8f8 = (code *)0x1d52a0;
    run_test_tty_file_cold_24();
  }
  pcStack_8f8 = run_test_tty_pty;
  run_test_tty_file_cold_25();
  handle = (uv_handle_t *)auStack_e78;
  puStack_900 = loop;
  pcStack_8f8 = (code *)piVar5;
  iVar2 = uv_loop_init(&uStack_c28);
  uStack_e58.data = (void *)(long)iVar2;
  uStack_d40.data = (void *)0x0;
  if ((uv__queue *)uStack_e58.data == (uv__queue *)0x0) {
    iVar2 = openpty(auStack_e78 + 0x14,auStack_e78 + 0x10,0,0,auStack_e78 + 0x18);
    if (iVar2 != 0) {
      run_test_tty_pty_cold_2();
      return 7;
    }
    iVar2 = uv_tty_init(&uStack_c28,&uStack_d40,auStack_e78._16_4_,0);
    uStack_e58.data = (void *)(long)iVar2;
    auStack_e78._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_e58.data != (uv__queue *)0x0) goto LAB_001d5503;
    iVar2 = uv_tty_init(&uStack_c28,(uv_tty_t *)(auStack_e78 + 0x20),auStack_e78._20_4_,0);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5510;
    iVar2 = uv_is_readable((uv_stream_t *)&uStack_d40);
    if (iVar2 == 0) goto LAB_001d551d;
    iVar2 = uv_is_writable((uv_stream_t *)&uStack_d40);
    if (iVar2 == 0) goto LAB_001d5522;
    iVar2 = uv_is_readable((uv_stream_t *)(auStack_e78 + 0x20));
    if (iVar2 == 0) goto LAB_001d5527;
    iVar2 = uv_is_writable((uv_stream_t *)(auStack_e78 + 0x20));
    if (iVar2 == 0) goto LAB_001d552c;
    auStack_e78._0_8_ = ZEXT48(uStack_d40.flags & 0x100000);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5531;
    if ((uStack_e58.flags._2_1_ & 0x10) == 0) goto LAB_001d553e;
    iVar2 = close(auStack_e78._16_4_);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5543;
    uv_close((uv_handle_t *)&uStack_d40,(uv_close_cb)0x0);
    iVar2 = close(auStack_e78._20_4_);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5550;
    uv_close((uv_handle_t *)(auStack_e78 + 0x20),(uv_close_cb)0x0);
    iVar2 = uv_run(&uStack_c28,UV_RUN_DEFAULT);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(&uStack_c28,close_walk_cb,(void *)0x0);
      uv_run(&uStack_c28,UV_RUN_DEFAULT);
      auStack_e78._0_8_ = (uv_loop_t *)0x0;
      iVar2 = uv_loop_close(&uStack_c28);
      auStack_e78._8_8_ = SEXT48(iVar2);
      if (auStack_e78._0_8_ == auStack_e78._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d556a;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d5503:
    run_test_tty_pty_cold_3();
LAB_001d5510:
    run_test_tty_pty_cold_4();
LAB_001d551d:
    run_test_tty_pty_cold_14();
LAB_001d5522:
    run_test_tty_pty_cold_13();
LAB_001d5527:
    run_test_tty_pty_cold_12();
LAB_001d552c:
    run_test_tty_pty_cold_11();
LAB_001d5531:
    run_test_tty_pty_cold_5();
LAB_001d553e:
    run_test_tty_pty_cold_10();
LAB_001d5543:
    run_test_tty_pty_cold_6();
LAB_001d5550:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d556a:
  run_test_tty_pty_cold_9();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  uv_os_fd_t ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  ttyin_fd = CreateFileA("conin$",
                         GENERIC_READ | GENERIC_WRITE,
                         FILE_SHARE_READ | FILE_SHARE_WRITE,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);
  ASSERT_PTR_NE(ttyin_fd, INVALID_HANDLE_VALUE);

  ttyout_fd = CreateFileA("conout$",
                          GENERIC_READ | GENERIC_WRITE,
                          FILE_SHARE_READ | FILE_SHARE_WRITE,
                          NULL,
                          OPEN_EXISTING,
                          FILE_ATTRIBUTE_NORMAL,
                          NULL);
  ASSERT_PTR_NE(ttyout_fd, INVALID_HANDLE_VALUE);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ASSERT_GE(ttyin_fd, 0);
  ASSERT_GE(ttyout_fd, 0);
#endif

  ASSERT_EQ(UV_UNKNOWN_HANDLE, uv_guess_handle((uv_os_fd_t) -1));

  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyin_fd));
  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyout_fd));

  r = uv_tty_init(loop, &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT_OK(r);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(loop, &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT_OK(r);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT_OK(r);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY(loop);
    return TEST_SKIP;
  }

  ASSERT_GT(width, 0);
  ASSERT_GT(height, 0);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT_OK(r);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT_OK(r);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}